

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O0

void __thiscall wasm::FunctionHasher::doWalkFunction(FunctionHasher *this,Function *func)

{
  size_t sVar1;
  mapped_type_conflict *pmVar2;
  function<bool_(wasm::Expression_*,_unsigned_long_&)> local_38;
  Function *local_18;
  Function *func_local;
  FunctionHasher *this_local;
  
  local_18 = func;
  func_local = (Function *)this;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function(&local_38,&this->customHasher)
  ;
  sVar1 = flexibleHashFunction(func,&local_38);
  pmVar2 = std::
           map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
           ::at(&this->output->
                 super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                ,&local_18);
  *pmVar2 = sVar1;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::~function(&local_38);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    output->at(func) = flexibleHashFunction(func, customHasher);
  }